

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O0

int re_doreplace(RSIZE plen,char *st)

{
  bool bVar1;
  int iVar2;
  char local_138 [8];
  char repstr [256];
  line *clp;
  int state;
  int num;
  int more;
  int s;
  int k;
  int j;
  char *st_local;
  RSIZE plen_local;
  
  repstr._248_8_ = curwp->w_dotp;
  bVar1 = true;
  s = 0;
  clp._0_4_ = 0;
  clp._4_4_ = 0;
  _k = st;
  do {
    do {
      while( true ) {
        while( true ) {
          if (!bVar1) {
            local_138[s] = '\0';
            iVar2 = lreplace(plen,local_138);
            return iVar2;
          }
          if ((int)clp != 0) break;
          if (*_k == '\\') {
            _k = _k + 1;
            clp._0_4_ = 1;
          }
          else if (*_k == '\0') {
            bVar1 = false;
          }
          else {
            local_138[s] = *_k;
            s = s + 1;
            if (0xff < s) {
              return 0;
            }
            _k = _k + 1;
          }
        }
        if ((int)clp != 1) break;
        if ((*_k < '0') || ('9' < *_k)) {
          if (*_k == '\0') {
            bVar1 = false;
          }
          else {
            local_138[s] = *_k;
            s = s + 1;
            if (0xff < s) {
              return 0;
            }
            _k = _k + 1;
            clp._0_4_ = 0;
          }
        }
        else {
          clp._4_4_ = *_k + -0x30;
          _k = _k + 1;
          clp._0_4_ = 2;
        }
      }
    } while ((int)clp != 2);
    if ((*_k < '0') || ('9' < *_k)) {
      if (9 < clp._4_4_) {
        return 0;
      }
      iVar2 = regex_match[clp._4_4_].rm_eo - regex_match[clp._4_4_].rm_so;
      if (0xff < s + iVar2) {
        return 0;
      }
      memmove(local_138 + s,
              (void *)(*(long *)(repstr._248_8_ + 0x18) + (long)regex_match[clp._4_4_].rm_so),
              (long)iVar2);
      s = iVar2 + s;
      if (*_k == '\0') {
        bVar1 = false;
      }
      if (*_k == '\\') {
        clp._0_4_ = 1;
      }
      else {
        local_138[s] = *_k;
        s = s + 1;
        if (0xff < s) {
          return 0;
        }
        clp._0_4_ = 0;
      }
    }
    else {
      clp._4_4_ = clp._4_4_ * 10 + (int)*_k + -0x30;
    }
    _k = _k + 1;
  } while( true );
}

Assistant:

static int
re_doreplace(RSIZE plen, char *st)
{
	int	 j, k, s, more, num, state;
	struct line	*clp;
	char	 repstr[REPLEN];

	clp = curwp->w_dotp;
	more = TRUE;
	j = 0;
	state = 0;
	num = 0;

	/* The following FSA parses the replacement string */
	while (more) {
		switch (state) {
		case 0:
			if (*st == '\\') {
				st++;
				state = 1;
			} else if (*st == '\0')
				more = FALSE;
			else {
				repstr[j] = *st;
				j++;
				if (j >= REPLEN)
					return (FALSE);
				st++;
			}
			break;
		case 1:
			if (*st >= '0' && *st <= '9') {
				num = *st - '0';
				st++;
				state = 2;
			} else if (*st == '\0')
				more = FALSE;
			else {
				repstr[j] = *st;
				j++;
				if (j >= REPLEN)
					return (FALSE);
				st++;
				state = 0;
			}
			break;
		case 2:
			if (*st >= '0' && *st <= '9') {
				num = 10 * num + *st - '0';
				st++;
			} else {
				if (num >= RE_NMATCH)
					return (FALSE);
				k = regex_match[num].rm_eo - regex_match[num].rm_so;
				if (j + k >= REPLEN)
					return (FALSE);
				bcopy(&(clp->l_text[regex_match[num].rm_so]),
				    &repstr[j], k);
				j += k;
				if (*st == '\0')
					more = FALSE;
				if (*st == '\\') {
					st++;
					state = 1;
				} else {
					repstr[j] = *st;
					j++;
					if (j >= REPLEN)
						return (FALSE);
					st++;
					state = 0;
				}
			}
			break;
		}		/* switch (state) */
	}			/* while (more)   */

	repstr[j] = '\0';
	s = lreplace(plen, repstr);
	return (s);
}